

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

int duckdb_lz4::LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  uint inputSize;
  int iVar1;
  tableType_t tableType;
  LZ4_stream_t ctxBody;
  
  iVar1 = 0;
  switchD_0130b471::default(&ctxBody,0,0x4020);
  inputSize = *srcSizePtr;
  if (inputSize < 0x7e000001) {
    iVar1 = (uint)((ulong)inputSize * 0x8080808081 >> 0x27) + 0x10;
  }
  if (targetDstSize < iVar1) {
    if ((int)inputSize < 0x1000b) {
      tableType = byU16;
    }
    else {
      tableType = byU32;
    }
    iVar1 = LZ4_compress_generic
                      (&ctxBody.internal_donotuse,src,dst,inputSize,srcSizePtr,targetDstSize,
                       fillOutput,tableType,noDict,noDictIssue,1);
  }
  else {
    iVar1 = LZ4_compress_fast_extState(&ctxBody,src,dst,inputSize,targetDstSize,1);
  }
  return iVar1;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}